

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionPrimitves.hpp
# Opt level: O0

bool Kernel::operator>(SelectedSummand *l,SelectedSummand *r)

{
  bool bVar1;
  
  bVar1 = operator<(l,r);
  return bVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, SelectedSummand const& self)
    { 
      self.numeral().apply([&](auto n) -> void { out << n; });
      out << " " << self.selectedAtom();
      self.numTraits()
        .apply([&](auto numTraits) {
          for (auto s : self.contextTerms<decltype(numTraits)>()) {
            out << " + " << s;
          }
        });
      out << " " << self.symbol() << " 0";
      for (auto l : self.contextLiterals()) {
        out << " \\/ " << *l;
      }
      return out; 
    }